

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcontainertools_impl.h
# Opt level: O1

void QtPrivate::
     q_relocate_overlap_n_left_move<std::reverse_iterator<QXdgDesktopPortalFileDialog::Filter*>,long_long>
               (reverse_iterator<QXdgDesktopPortalFileDialog::Filter_*> first,longlong n,
               reverse_iterator<QXdgDesktopPortalFileDialog::Filter_*> d_first)

{
  Filter *pFVar1;
  Data *pDVar2;
  undefined8 uVar3;
  char16_t *pcVar4;
  qsizetype qVar5;
  Data *pDVar6;
  FilterCondition *pFVar7;
  int *piVar8;
  Filter *pFVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  reverse_iterator<QXdgDesktopPortalFileDialog::Filter_*> *prVar12;
  Filter *pFVar13;
  Filter *pFVar14;
  long in_FS_OFFSET;
  Destructor local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_48.iter = &local_48.intermediate;
  local_48.end.current = (Filter *)((d_first.current)->name).d.d;
  pFVar13 = local_48.end.current + -n;
  pFVar1 = (Filter *)((first.current)->name).d.d;
  pFVar14 = pFVar1;
  pFVar9 = pFVar13;
  if (pFVar13 < pFVar1) {
    pFVar14 = pFVar13;
    pFVar9 = pFVar1;
  }
  pFVar1 = (Filter *)((d_first.current)->name).d.d;
  while (pFVar1 != pFVar9) {
    pDVar2 = ((first.current)->name).d.d;
    uVar3 = *(undefined8 *)&pDVar2[-3].super_QArrayData;
    pDVar2[-3].super_QArrayData.ref_ = (Type)0x0;
    pDVar2[-3].super_QArrayData.flags = (QFlagsStorageHelper<QArrayData::ArrayOption,_4>)0x0;
    *(undefined8 *)&pFVar1[-1].name.d.d = uVar3;
    pcVar4 = (char16_t *)pDVar2[-3].super_QArrayData.alloc;
    pDVar2[-3].super_QArrayData.alloc = 0;
    pFVar1[-1].name.d.ptr = pcVar4;
    qVar5 = *(qsizetype *)&pDVar2[-2].super_QArrayData;
    pDVar2[-2].super_QArrayData.ref_ = (Type)0x0;
    pDVar2[-2].super_QArrayData.flags = (QFlagsStorageHelper<QArrayData::ArrayOption,_4>)0x0;
    pFVar1[-1].name.d.size = qVar5;
    pDVar6 = (Data *)pDVar2[-2].super_QArrayData.alloc;
    pDVar2[-2].super_QArrayData.alloc = 0;
    pFVar1[-1].filterConditions.d.d = pDVar6;
    pFVar7 = *(FilterCondition **)&pDVar2[-1].super_QArrayData;
    pDVar2[-1].super_QArrayData.ref_ = (Type)0x0;
    pDVar2[-1].super_QArrayData.flags = (QFlagsStorageHelper<QArrayData::ArrayOption,_4>)0x0;
    pFVar1[-1].filterConditions.d.ptr = pFVar7;
    qVar5 = pDVar2[-1].super_QArrayData.alloc;
    pDVar2[-1].super_QArrayData.alloc = 0;
    pFVar1[-1].filterConditions.d.size = qVar5;
    ((d_first.current)->name).d.d = ((d_first.current)->name).d.d + -3;
    ((first.current)->name).d.d = ((first.current)->name).d.d + -3;
    pFVar1 = (Filter *)((d_first.current)->name).d.d;
  }
  local_48.intermediate.current = (Filter *)((d_first.current)->name).d.d;
  while (pFVar1 = (Filter *)((d_first.current)->name).d.d, prVar12 = &local_48.end,
        pFVar1 != pFVar13) {
    pDVar2 = ((first.current)->name).d.d;
    uVar3 = *(undefined8 *)&pFVar1[-1].name.d.d;
    *(undefined8 *)&pFVar1[-1].name.d.d = *(undefined8 *)&pDVar2[-3].super_QArrayData;
    pDVar2[-3].super_QArrayData.ref_ = (QBasicAtomicInt)(int)uVar3;
    pDVar2[-3].super_QArrayData.flags = (ArrayOptions)(int)((ulong)uVar3 >> 0x20);
    pcVar4 = pFVar1[-1].name.d.ptr;
    pFVar1[-1].name.d.ptr = (char16_t *)pDVar2[-3].super_QArrayData.alloc;
    pDVar2[-3].super_QArrayData.alloc = (qsizetype)pcVar4;
    uVar10 = *(undefined4 *)&pFVar1[-1].name.d.size;
    uVar11 = *(undefined4 *)((long)&pFVar1[-1].name.d.size + 4);
    pFVar1[-1].name.d.size = *(qsizetype *)&pDVar2[-2].super_QArrayData;
    pDVar2[-2].super_QArrayData.ref_ = (QBasicAtomicInt)uVar10;
    pDVar2[-2].super_QArrayData.flags = (ArrayOptions)uVar11;
    QArrayDataPointer<QXdgDesktopPortalFileDialog::FilterCondition>::operator=
              (&pFVar1[-1].filterConditions.d,
               (QArrayDataPointer<QXdgDesktopPortalFileDialog::FilterCondition> *)
               &pDVar2[-2].super_QArrayData.alloc);
    ((d_first.current)->name).d.d = ((d_first.current)->name).d.d + -3;
    ((first.current)->name).d.d = ((first.current)->name).d.d + -3;
  }
  while (local_48.iter = prVar12, pFVar1 = (Filter *)((first.current)->name).d.d, pFVar1 != pFVar14)
  {
    ((first.current)->name).d.d = (Data *)(pFVar1 + 1);
    QArrayDataPointer<QXdgDesktopPortalFileDialog::FilterCondition>::~QArrayDataPointer
              (&(pFVar1->filterConditions).d);
    piVar8 = *(int **)&(pFVar1->name).d.d;
    prVar12 = local_48.iter;
    if (piVar8 != (int *)0x0) {
      LOCK();
      *piVar8 = *piVar8 + -1;
      UNLOCK();
      if (*piVar8 == 0) {
        QArrayData::deallocate(*(QArrayData **)&(pFVar1->name).d.d,2,0x10);
        prVar12 = local_48.iter;
      }
    }
  }
  q_relocate_overlap_n_left_move<std::reverse_iterator<QXdgDesktopPortalFileDialog::Filter_*>,_long_long>
  ::Destructor::~Destructor(&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void q_relocate_overlap_n_left_move(iterator first, N n, iterator d_first)
{
    // requires: [first, n) is a valid range
    // requires: d_first + n is reachable from d_first
    // requires: iterator is at least a random access iterator
    // requires: value_type(iterator) has a non-throwing destructor

    Q_ASSERT(n);
    Q_ASSERT(d_first < first); // only allow moves to the "left"
    using T = typename std::iterator_traits<iterator>::value_type;

    // Watches passed iterator. Unless commit() is called, all the elements that
    // the watched iterator passes through are deleted at the end of object
    // lifetime. freeze() could be used to stop watching the passed iterator and
    // remain at current place.
    //
    // requires: the iterator is expected to always point to an invalid object
    //           (to uninitialized memory)
    struct Destructor
    {
        iterator *iter;
        iterator end;
        iterator intermediate;

        Destructor(iterator &it) noexcept : iter(std::addressof(it)), end(it) { }
        void commit() noexcept { iter = std::addressof(end); }
        void freeze() noexcept
        {
            intermediate = *iter;
            iter = std::addressof(intermediate);
        }
        ~Destructor() noexcept
        {
            for (const int step = *iter < end ? 1 : -1; *iter != end;) {
                std::advance(*iter, step);
                (*iter)->~T();
            }
        }
    } destroyer(d_first);

    const iterator d_last = d_first + n;
    // Note: use pair and explicitly copy iterators from it to prevent
    // accidental reference semantics instead of copy. equivalent to:
    //
    // auto [overlapBegin, overlapEnd] = std::minmax(d_last, first);
    auto pair = std::minmax(d_last, first);

    // overlap area between [d_first, d_first + n) and [first, first + n) or an
    // uninitialized memory area between the two ranges
    iterator overlapBegin = pair.first;
    iterator overlapEnd = pair.second;

    // move construct elements in uninitialized region
    while (d_first != overlapBegin) {
        // account for std::reverse_iterator, cannot use new(d_first) directly
        new (std::addressof(*d_first)) T(std::move_if_noexcept(*first));
        ++d_first;
        ++first;
    }

    // cannot commit but have to stop - there might be an overlap region
    // which we don't want to delete (because it's part of existing data)
    destroyer.freeze();

    // move assign elements in overlap region
    while (d_first != d_last) {
        *d_first = std::move_if_noexcept(*first);
        ++d_first;
        ++first;
    }

    Q_ASSERT(d_first == destroyer.end + n);
    destroyer.commit(); // can commit here as ~T() below does not throw

    while (first != overlapEnd)
        (--first)->~T();
}